

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator(void)

{
  ncnn_allocator_t _allocator;
  UnlockedPoolAllocator_c_api *this;
  
  _allocator = (ncnn_allocator_t)malloc(0x18);
  this = (UnlockedPoolAllocator_c_api *)operator_new(0x18);
  UnlockedPoolAllocator_c_api::UnlockedPoolAllocator_c_api(this,_allocator);
  _allocator->pthis = this;
  _allocator->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
  _allocator->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
  return _allocator;
}

Assistant:

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator()
{
    ncnn_allocator_t allocator = (ncnn_allocator_t)malloc(sizeof(struct __ncnn_allocator_t));
    allocator->pthis = (void*)(new UnlockedPoolAllocator_c_api(allocator));
    allocator->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
    allocator->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
    return allocator;
}